

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool __thiscall
bssl::tls13_derive_session_psk
          (bssl *this,SSL_SESSION *session,Span<const_unsigned_char> nonce,bool is_dtls)

{
  string_view label;
  Span<const_unsigned_char> hash;
  EVP_MD *digest_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  Span<const_unsigned_char> local_50;
  Span<unsigned_char> local_40;
  EVP_MD *local_30;
  EVP_MD *digest;
  bssl *pbStack_20;
  bool is_dtls_local;
  SSL_SESSION *session_local;
  Span<const_unsigned_char> nonce_local;
  
  nonce_local.data_ = nonce.data_;
  digest._7_1_ = (byte)nonce.size_ & 1;
  pbStack_20 = this;
  session_local = session;
  local_30 = (EVP_MD *)ssl_session_get_digest((SSL_SESSION *)this);
  sVar3 = InplaceVector<unsigned_char,_64UL>::size
                    ((InplaceVector<unsigned_char,_64UL> *)(pbStack_20 + 10));
  iVar2 = EVP_MD_size(local_30);
  if (sVar3 == CONCAT44(extraout_var,iVar2)) {
    Span<unsigned_char>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              (&local_40,(InplaceVector<unsigned_char,_64UL> *)(pbStack_20 + 10));
    digest_00 = local_30;
    Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              ((Span<unsigned_char_const> *)&local_50,
               (InplaceVector<unsigned_char,_64UL> *)(pbStack_20 + 10));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"resumption")
    ;
    label._M_str = local_60._M_str;
    label._M_len = local_60._M_len;
    hash.size_ = (size_t)nonce_local.data_;
    hash.data_ = (uchar *)session_local;
    bVar1 = hkdf_expand_label(local_40,(EVP_MD *)digest_00,local_50,label,hash,
                              (bool)(digest._7_1_ & 1));
    return bVar1;
  }
  __assert_fail("session->secret.size() == EVP_MD_size(digest)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                ,0x1d2,
                "bool bssl::tls13_derive_session_psk(SSL_SESSION *, Span<const uint8_t>, bool)");
}

Assistant:

bool tls13_derive_session_psk(SSL_SESSION *session, Span<const uint8_t> nonce,
                              bool is_dtls) {
  const EVP_MD *digest = ssl_session_get_digest(session);
  // The session initially stores the resumption_master_secret, which we
  // override with the PSK.
  assert(session->secret.size() == EVP_MD_size(digest));
  return hkdf_expand_label(Span(session->secret), digest, session->secret,
                           kTLS13LabelResumptionPSK, nonce, is_dtls);
}